

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair1_poly_test.c
# Opt level: O0

void test_poly_best_effort(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  int i;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_msg *msg;
  nng_socket c1;
  nng_socket s1;
  
  nVar1 = nng_pair1_open_poly((nng_socket *)((long)&msg + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                         ,0x2e,"%s: expected success, got %s (%d)","nng_pair1_open_poly(&s1)",pcVar3
                         ,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_pair1_open((nng_socket *)&msg);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                         ,0x2f,"%s: expected success, got %s (%d)","nng_pair1_open(&c1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_int(msg._4_4_,"recv-buffer",1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                         ,0x31,"%s: expected success, got %s (%d)",
                         "nng_socket_set_int(s1, NNG_OPT_RECVBUF, 1)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_int(msg._4_4_,"send-buffer",1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                         ,0x32,"%s: expected success, got %s (%d)",
                         "nng_socket_set_int(s1, NNG_OPT_SENDBUF, 1)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_int(msg._0_4_,"recv-buffer",1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                         ,0x33,"%s: expected success, got %s (%d)",
                         "nng_socket_set_int(c1, NNG_OPT_RECVBUF, 1)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(msg._4_4_,"send-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                         ,0x34,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, SECOND)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nuts_marry(msg._4_4_,msg._0_4_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                         ,0x36,"%s: expected success, got %s (%d)","nuts_marry(s1, c1)",pcVar3,nVar1
                        );
  if (iVar2 == 0) {
    acutest_abort_();
  }
  result__8 = NNG_OK;
  while( true ) {
    if (9 < (int)result__8) {
      nVar1 = nng_socket_close(msg._4_4_);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                             ,0x3d,"%s: expected success, got %s (%d)","nng_socket_close(s1)",pcVar3
                             ,nVar1);
      if (iVar2 == 0) {
        acutest_abort_();
      }
      nVar1 = nng_socket_close(msg._0_4_);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                             ,0x3e,"%s: expected success, got %s (%d)","nng_socket_close(c1)",pcVar3
                             ,nVar1);
      if (iVar2 == 0) {
        acutest_abort_();
      }
      return;
    }
    nVar1 = nng_msg_alloc((nng_msg **)&result__1,0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                           ,0x39,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar3
                           ,nVar1);
    if (iVar2 == 0) {
      acutest_abort_();
    }
    nVar1 = nng_sendmsg(msg._4_4_,_result__1,0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                           ,0x3a,"%s: expected success, got %s (%d)","nng_sendmsg(s1, msg, 0)",
                           pcVar3,nVar1);
    if (iVar2 == 0) break;
    result__8 = result__8 + NNG_EINTR;
  }
  acutest_abort_();
}

Assistant:

void
test_poly_best_effort(void)
{
	nng_socket s1;
	nng_socket c1;
	nng_msg   *msg;

	NUTS_PASS(nng_pair1_open_poly(&s1));
	NUTS_PASS(nng_pair1_open(&c1));

	NUTS_PASS(nng_socket_set_int(s1, NNG_OPT_RECVBUF, 1));
	NUTS_PASS(nng_socket_set_int(s1, NNG_OPT_SENDBUF, 1));
	NUTS_PASS(nng_socket_set_int(c1, NNG_OPT_RECVBUF, 1));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, SECOND));

	NUTS_MARRY(s1, c1);

	for (int i = 0; i < 10; i++) {
		NUTS_PASS(nng_msg_alloc(&msg, 0));
		NUTS_PASS(nng_sendmsg(s1, msg, 0));
	}

	NUTS_CLOSE(s1);
	NUTS_CLOSE(c1);
}